

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O2

DetectorResults *
ZXing::DataMatrix::Detect
          (DetectorResults *__return_storage_ptr__,BitMatrix *image,bool tryHarder,bool tryRotate,
          bool isPure)

{
  size_t __n;
  PointT<int> PVar1;
  PointF *__return_storage_ptr___00;
  undefined4 uVar2;
  undefined4 uVar3;
  BitMatrix *pBVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  uint width_00;
  ResultPoint b2;
  ResultPoint b1;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined7 extraout_var;
  size_t sVar14;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  ResultPoint *pRVar17;
  iterator iVar18;
  uint uVar19;
  int iVar20;
  undefined7 in_register_00000009;
  PointT<int> PVar21;
  pointer puVar22;
  PointT<int> PVar23;
  int iVar24;
  pointer puVar25;
  undefined4 *puVar26;
  ResultPoint *from;
  PointT<int> PVar27;
  uint uVar28;
  PointT<int> PVar29;
  uint uVar30;
  __0 *this;
  long lVar31;
  ResultPoint *pRVar32;
  pointer pcVar33;
  undefined4 *puVar34;
  ResultPoint *pRVar35;
  PointT<int> PVar36;
  EdgeTracer *pEVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar40;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  BitMatrix *pBVar41;
  pointer pcVar53;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar54;
  double dVar55;
  double dVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  PointT<double> PVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  float subSampling;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  PointF PVar80;
  PointF dir;
  PointF dEdge;
  PointF dir_00;
  PointF dEdge_00;
  PointF dir_01;
  PointF dEdge_01;
  PointF dEdge_02;
  PointF dir_02;
  PointF dEdge_03;
  PointT<double> PVar81;
  PointF a;
  PointF b2_00;
  ResultPoint correctedTopRight;
  undefined4 uStack_44c;
  ResultPoint pointC;
  int height;
  pointer pcStack_400;
  _Base_ptr local_3f8;
  PointT<double> PStack_3f0;
  ByteMatrix *pBStack_3e0;
  int local_3d8;
  undefined4 uStack_3d4;
  ResultPoint pointD;
  PointF local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  BitMatrix *local_360;
  int width;
  int iStack_354;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_350;
  PointT<int> local_338;
  PointT<int> PStack_330;
  PointT<int> local_328;
  PointT<int> PStack_320;
  BitMatrixCursorI cur;
  float local_2a8;
  float fStack_2a4;
  int left;
  ResultPoint *pRStack_290;
  PointT<double> local_288;
  PointT<double> local_278;
  PointT<double> local_268;
  pointer local_258;
  pointer pcStack_250;
  int top;
  uint uStack_244;
  undefined8 uStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  ByteMatrix *pBStack_220;
  double local_218;
  ByteMatrix *pBStack_210;
  ResultPoint pointA;
  _Base_ptr p_Stack_1f8;
  undefined4 uStack_1d4;
  EdgeTracer local_1c8;
  ByteMatrix history;
  array<ZXing::DataMatrix::DMRegressionLine,_4UL> lines;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  PointT<double> PVar82;
  
  local_378._0_4_ = (int)CONCAT71(in_register_00000009,tryRotate);
  bVar9 = BitMatrix::findBoundingBox(image,&left,&top,&width,&height,8);
  if (bVar9) {
    cur.p.y = top;
    cur.p.x = left;
    cur.d.x = 0;
    cur.d.y = 1;
    cur.img = image;
    iVar11 = BitMatrixCursor<ZXing::PointT<int>_>::countEdges(&cur,height + -1);
    if (iVar11 != 0) {
LAB_00165272:
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->_bits)._width = 0;
      (__return_storage_ptr__->_bits)._height = 0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_001652a0;
    }
    PVar21.y = -cur.d.x;
    PVar21.x = cur.d.y;
    cur.d = PVar21;
    iVar11 = BitMatrixCursor<ZXing::PointT<int>_>::countEdges(&cur,width + -1);
    if (iVar11 != 0) goto LAB_00165272;
    PVar23.y = -cur.d.x;
    PVar23.x = cur.d.y;
    cur.d = PVar23;
    uVar63 = BitMatrixCursor<ZXing::PointT<int>_>::countEdges(&cur,height + -1);
    PVar36.y = -cur.d.x;
    PVar36.x = cur.d.y;
    cur.d = PVar36;
    uVar30 = BitMatrixCursor<ZXing::PointT<int>_>::countEdges(&cur,width + -1);
    if (((((uVar30 & 1) == 0) || (uVar63 - 0x90 < 0xffffff77)) || ((uVar63 & 1) == 0)) ||
       (uVar30 - 0x90 < 0xffffff79)) {
LAB_00166420:
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->_bits)._width = 0;
      (__return_storage_ptr__->_bits)._height = 0;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      puVar25 = (pointer)0x0;
      puVar22 = (pointer)0x0;
    }
    else {
      fVar72 = (float)width / (float)(int)(uVar30 + 1);
      fVar73 = (float)height / (float)(int)(uVar63 + 1);
      if (1.0 < ABS(fVar72 - fVar73)) goto LAB_00166420;
      subSampling = (fVar72 + fVar73) * 0.5;
      PVar67.x = (double)((float)(int)uVar30 * subSampling + (float)left + fVar72 * 0.5);
      PVar67.y = (double)((float)(int)uVar63 * subSampling + (float)top + fVar73 * 0.5);
      bVar9 = BitMatrix::isIn<double>(image,PVar67,0);
      if (!bVar9) goto LAB_00166420;
      uVar28 = (width + left) - 1;
      iVar11 = top + -1 + height;
      Deflate((BitMatrix *)&lines,image,uVar30 + 1,uVar63 + 1,fVar72 * 0.5 + (float)top,
              fVar73 * 0.5 + (float)left,subSampling);
      PVar1.y = top;
      PVar1.x = left;
      PVar29.y = iVar11;
      PVar29.x = uVar28;
      PVar27.y = iVar11;
      PVar27.x = left;
      *(pointer *)&__return_storage_ptr__->_bits =
           lines._M_elems[0].super_RegressionLine._points.
           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)lines._M_elems[0].super_RegressionLine._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)lines._M_elems[0].super_RegressionLine._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)lines._M_elems[0].super_RegressionLine._directionInward.x;
      lines._M_elems[0].super_RegressionLine._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lines._M_elems[0].super_RegressionLine._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lines._M_elems[0].super_RegressionLine._directionInward.x = 0.0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
           (PointT<int>)((long)_top << 0x20 | (ulong)uVar28);
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = PVar29;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PVar27;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&lines._M_elems[0].super_RegressionLine._points.
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data + 8));
      puVar22 = (__return_storage_ptr__->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar25 = (__return_storage_ptr__->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  else {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001652a0:
    puVar25 = (pointer)0x0;
    puVar22 = (pointer)0x0;
  }
  if (puVar22 == puVar25 && !isPure) {
    history.super_Matrix<signed_char>._data.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    history.super_Matrix<signed_char>._data.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    history.super_Matrix<signed_char>._width = 0;
    history.super_Matrix<signed_char>._height = 0;
    history.super_Matrix<signed_char>._data.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::array<ZXing::DataMatrix::DMRegressionLine,_4UL>::array(&lines);
    pcVar33 = (pointer)0x0;
    while (pcVar33 != (pointer)0x40) {
      dVar38 = *(double *)*(undefined1 (*) [12])(&DAT_0019c9a8 + (long)pcVar33);
      dVar39 = *(double *)(&UNK_0019c9b0 + (long)pcVar33);
      auVar6 = *(undefined1 (*) [12])(&DAT_0019c9a8 + (long)pcVar33);
      uVar2 = image->_width;
      uVar3 = image->_height;
      uStack_44c = (undefined4)((ulong)dVar39 >> 0x20);
      dVar38 = floor(dVar38 * 8.0 + ((double)((int)uVar2 / 2) - dVar38 * (double)((int)uVar2 / 2)));
      dVar39 = floor(dVar39 * 8.0 + ((double)((int)uVar3 / 2) - dVar39 * (double)((int)uVar3 / 2)));
      if ((long)history.super_Matrix<signed_char>._data.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)history.super_Matrix<signed_char>._data.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        memset(history.super_Matrix<signed_char>._data.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               (long)history.super_Matrix<signed_char>._data.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)history.super_Matrix<signed_char>._data.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
      auVar64._12_4_ = uStack_44c;
      auVar64._0_12_ = auVar6;
      dVar54 = SUB168(auVar64 & _DAT_0019b270,8);
      dVar61 = SUB168(auVar64 & _DAT_0019b270,0);
      if (dVar54 <= dVar61) {
        dVar54 = dVar61;
      }
      auVar57._8_8_ = dVar54;
      auVar57._0_8_ = dVar54;
      auVar64 = divpd(auVar64,auVar57);
      dVar54 = auVar64._0_8_;
      p_Stack_1f8 = (_Base_ptr)(dVar54 * 0.0 + dVar39 + 0.5);
      pointA.super_PointF.y = (dVar38 + 0.5) - auVar64._8_8_ * 0.0;
      pointA.super_PointF.x = (double)image;
      bVar9 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                        ((BitMatrixCursor<ZXing::PointT<double>_> *)&pointA);
      if (bVar9) {
        while( true ) {
          bVar9 = EdgeTracer::moveToNextWhiteAfterBlack((EdgeTracer *)&pointA);
          if (!bVar9) break;
          pointC.super_PointF = (PointF)ZEXT816(0);
          pointD.super_PointF = (PointF)ZEXT816(0);
          correctedTopRight.super_PointF = (PointF)ZEXT816(0);
          local_398 = (PointF)ZEXT816(0);
          for (lVar31 = 0; lVar31 != 0x100; lVar31 = lVar31 + 0x40) {
            RegressionLine::reset
                      ((RegressionLine *)
                       ((long)&lines._M_elems[0].super_RegressionLine._points.
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data + lVar31));
          }
          pBStack_3e0 = (ByteMatrix *)0x0;
          local_3f8 = p_Stack_1f8;
          _height = (BitMatrix *)pointA.super_PointF.x;
          pcStack_400 = (pointer)pointA.super_PointF.y;
          PVar80.y = (double)((ulong)auVar64._8_8_ ^ (ulong)DAT_0019b280);
          PStack_3f0.y = dVar54;
          PStack_3f0.x = PVar80.y;
          uStack_3d4 = uStack_1d4;
          local_3d8 = 1;
          PVar80.x = (double)((ulong)dVar54 ^ (ulong)DAT_0019b280);
          bVar9 = EdgeTracer::traceLine((EdgeTracer *)&height,PVar80,(RegressionLine *)&lines);
          if (bVar9) {
            dir.x = -PStack_3f0.y;
            dir.y = PStack_3f0.x;
            bVar9 = EdgeTracer::traceCorner((EdgeTracer *)&height,dir,&pointC.super_PointF);
            if (bVar9) {
              DMRegressionLine::reverse((DMRegressionLine *)&lines);
              local_1c8.history = pBStack_3e0;
              local_1c8.super_BitMatrixCursorF.p.y = (double)local_3f8;
              local_1c8.super_BitMatrixCursorF.d = PStack_3f0;
              local_1c8.state = local_3d8;
              local_1c8._52_4_ = uStack_3d4;
              local_1c8.super_BitMatrixCursorF.img = _height;
              local_1c8.super_BitMatrixCursorF.p.x = (double)pcStack_400;
              local_3f8 = p_Stack_1f8;
              pBStack_3e0 = (ByteMatrix *)0x0;
              _height = (BitMatrix *)pointA.super_PointF.x;
              pcStack_400 = (pointer)pointA.super_PointF.y;
              local_3d8 = 1;
              auVar42._0_8_ = (ulong)PStack_3f0.y ^ (ulong)DAT_0019b280;
              auVar42._8_8_ = PStack_3f0.x;
              dVar38 = ABS(PStack_3f0.x);
              if (ABS(PStack_3f0.x) <= ABS(PStack_3f0.y)) {
                dVar38 = ABS(PStack_3f0.y);
              }
              auVar65._8_8_ = dVar38;
              auVar65._0_8_ = dVar38;
              PStack_3f0 = (PointT<double>)divpd(auVar42,auVar65);
              dEdge.y = (double)((ulong)PStack_3f0.x ^ (ulong)DAT_0019b280);
              dEdge.x = PStack_3f0.y;
              bVar9 = EdgeTracer::traceLine((EdgeTracer *)&height,dEdge,(RegressionLine *)&lines);
              if (bVar9) {
                bVar9 = DMRegressionLine::truncateIfLShape((DMRegressionLine *)&lines);
                if (bVar9) {
                  pcStack_400 = (pointer)lines._M_elems[0].super_RegressionLine._points.
                                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].x;
                  local_3f8 = (_Base_ptr)
                              lines._M_elems[0].super_RegressionLine._points.
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].y;
                }
                EdgeTracer::updateDirectionFromOrigin((EdgeTracer *)&height,pointC.super_PointF);
                dVar38 = PStack_3f0.x;
                dVar39 = PStack_3f0.y;
                dir_00.y = -PStack_3f0.x;
                dVar61 = -PStack_3f0.y;
                dir_00.x = PStack_3f0.y;
                bVar9 = EdgeTracer::traceCorner((EdgeTracer *)&height,dir_00,&pointD.super_PointF);
                if (bVar9) {
                  local_3d8 = 2;
                  dEdge_00.y = -PStack_3f0.x;
                  dEdge_00.x = PStack_3f0.y;
                  bVar9 = EdgeTracer::traceLine
                                    ((EdgeTracer *)&height,dEdge_00,
                                     &lines._M_elems[1].super_RegressionLine);
                  if (bVar9) {
                    EdgeTracer::updateDirectionFromOrigin((EdgeTracer *)&height,pointD.super_PointF)
                    ;
                    PVar67 = PStack_3f0;
                    dir_01.y = -PStack_3f0.x;
                    dir_01.x = PStack_3f0.y;
                    bVar9 = EdgeTracer::traceCorner
                                      ((EdgeTracer *)&height,dir_01,&correctedTopRight.super_PointF)
                    ;
                    if (bVar9) {
                      auVar56._8_8_ = correctedTopRight.super_PointF.x;
                      auVar56._0_8_ = pointD.super_PointF.x;
                      auVar66._0_8_ =
                           (pointC.super_PointF.x - pointD.super_PointF.x) *
                           (pointC.super_PointF.x - pointD.super_PointF.x) +
                           (pointC.super_PointF.y - pointD.super_PointF.y) *
                           (pointC.super_PointF.y - pointD.super_PointF.y);
                      auVar66._8_8_ =
                           (pointD.super_PointF.x - correctedTopRight.super_PointF.x) *
                           (pointD.super_PointF.x - correctedTopRight.super_PointF.x) +
                           (pointD.super_PointF.y - correctedTopRight.super_PointF.y) *
                           (pointD.super_PointF.y - correctedTopRight.super_PointF.y);
                      auVar57 = sqrtpd(auVar56,auVar66);
                      dVar55 = auVar57._0_8_ + -1.0;
                      dVar62 = auVar57._8_8_ + -1.0;
                      auVar43._8_8_ = -(ulong)(dVar62 < 10.0);
                      auVar43._0_8_ = -(ulong)(dVar55 < 8.0);
                      iVar11 = movmskpd((int)CONCAT71(extraout_var,bVar9),auVar43);
                      if (((dVar62 <= dVar55 * 18.0) && (dVar55 * 0.25 <= dVar62)) && (iVar11 == 0))
                      {
                        auVar57 = (undefined1  [16])PVar67 & _DAT_0019b270;
                        dVar40 = auVar57._8_8_;
                        dVar79 = auVar57._0_8_;
                        if (dVar40 <= dVar79) {
                          dVar40 = dVar79;
                        }
                        auVar58._8_8_ = dVar40;
                        auVar58._0_8_ = dVar40;
                        PVar67 = (PointT<double>)divpd((undefined1  [16])PVar67,auVar58);
                        local_1c8.super_BitMatrixCursorF.d = PVar67;
                        RegressionLine::RegressionLine((RegressionLine *)&cur);
                        dEdge_01.y = PVar67.x;
                        dEdge_01.x = -PVar67.y;
                        local_258 = pcVar33;
                        bVar9 = EdgeTracer::traceGaps
                                          (&local_1c8,dEdge_01,
                                           &lines._M_elems[3].super_RegressionLine,
                                           (int)(dVar62 / 5.0 + 1.0),(RegressionLine *)&cur,
                                           dVar62 * 0.5);
                        std::
                        _Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ::~_Vector_base((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                         *)&cur);
                        pcVar33 = local_258;
                        if (bVar9) {
                          iVar12 = RegressionLine::length(&lines._M_elems[3].super_RegressionLine);
                          iVar11 = (int)(dVar55 / 5.0);
                          if (iVar12 / 3 < (int)(dVar55 / 5.0)) {
                            iVar11 = iVar12 / 3;
                          }
                          dVar40 = ABS(dVar39);
                          if (ABS(dVar39) <= ABS(dVar38)) {
                            dVar40 = ABS(dVar38);
                          }
                          auVar59._8_8_ = dVar40;
                          auVar59._0_8_ = dVar40;
                          auVar5._8_8_ = dVar61;
                          auVar5._0_8_ = dir_00.y;
                          PStack_3f0 = (PointT<double>)divpd(auVar5,auVar59);
                          local_3d8 = 3;
                          dEdge_02.y = -PStack_3f0.x;
                          dEdge_02.x = PStack_3f0.y;
                          bVar9 = EdgeTracer::traceGaps
                                            ((EdgeTracer *)&height,dEdge_02,
                                             &lines._M_elems[2].super_RegressionLine,iVar11 * 2,
                                             &lines._M_elems[3].super_RegressionLine,0.0);
                          if (bVar9) {
                            dir_02.y = -PStack_3f0.x;
                            dir_02.x = PStack_3f0.y;
                            bVar9 = EdgeTracer::traceCorner((EdgeTracer *)&height,dir_02,&local_398)
                            ;
                            if (bVar9) {
                              if (ABS((SQRT((pointC.super_PointF.x - local_398.x) *
                                            (pointC.super_PointF.x - local_398.x) +
                                            (pointC.super_PointF.y - local_398.y) *
                                            (pointC.super_PointF.y - local_398.y)) + -1.0) - dVar62)
                                  / dVar62 < 0.5) {
                                if (((ABS((SQRT((local_398.x - correctedTopRight.super_PointF.x) *
                                                (local_398.x - correctedTopRight.super_PointF.x) +
                                                (local_398.y - correctedTopRight.super_PointF.y) *
                                                (local_398.y - correctedTopRight.super_PointF.y)) +
                                          -1.0) - dVar55) / dVar55 < 0.5) &&
                                    (0x40 < (ulong)((long)lines._M_elems[3].super_RegressionLine.
                                                          _points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)lines._M_elems[3].super_RegressionLine.
                                                        _points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))) &&
                                   (0x40 < (ulong)((long)lines._M_elems[2].super_RegressionLine.
                                                         _points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)lines._M_elems[2].super_RegressionLine.
                                                        _points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))) {
                                  dEdge_03.x = -local_1c8.super_BitMatrixCursorF.d.y;
                                  dEdge_03.y = local_1c8.super_BitMatrixCursorF.d.x;
                                  bVar9 = EdgeTracer::traceGaps
                                                    (&local_1c8,dEdge_03,
                                                     &lines._M_elems[3].super_RegressionLine,
                                                     iVar11 * 2,
                                                     &lines._M_elems[2].super_RegressionLine,0.0);
                                  if (bVar9) {
                                    cur.img = (BitMatrix *)&lines;
                                    cur.p = (PointT<int>)(lines._M_elems + 1);
                                    cur.d = (PointT<int>)(lines._M_elems + 3);
                                    for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 8) {
                                      RegressionLine::evaluate
                                                (*(RegressionLine **)((long)&cur.img + lVar31),1.0,
                                                 false);
                                    }
                                    pointD.super_PointF =
                                         intersect(&lines._M_elems[1].super_RegressionLine,
                                                   (RegressionLine *)&lines);
                                    pointC.super_PointF =
                                         intersect(&lines._M_elems[3].super_RegressionLine,
                                                   (RegressionLine *)&lines);
                                    local_398 = intersect(&lines._M_elems[3].super_RegressionLine,
                                                          &lines._M_elems[2].super_RegressionLine);
                                    correctedTopRight.super_PointF =
                                         intersect(&lines._M_elems[1].super_RegressionLine,
                                                   &lines._M_elems[2].super_RegressionLine);
                                    dVar38 = DMRegressionLine::modules
                                                       (lines._M_elems + 3,pointC.super_PointF,
                                                        local_398);
                                    this = (__0 *)(lines._M_elems + 2);
                                    auVar44._0_8_ =
                                         DMRegressionLine::modules
                                                   ((DMRegressionLine *)this,
                                                    correctedTopRight.super_PointF,local_398);
                                    PVar80 = local_398;
                                    b1 = pointD;
                                    b2 = pointC;
                                    auVar44._8_8_ = dVar38;
                                    uVar63 = (uint)((ulong)(SUB168(auVar44 & _DAT_0019b270,0) +
                                                           -0x10000000000000) >> 0x20);
                                    uVar30 = (uint)((ulong)(SUB168(auVar44 & _DAT_0019b270,8) +
                                                           -0x10000000000000) >> 0x20);
                                    uVar28 = uVar63 ^ 0x80000000;
                                    auVar60._0_4_ = -(uint)(-0x200001 < (int)uVar28);
                                    auVar60._4_4_ = -(uint)(-0x200001 < (int)(uVar63 ^ 0x80000000));
                                    auVar60._8_4_ = -(uint)(-0x200001 < (int)(uVar30 ^ 0x80000000));
                                    auVar60._12_4_ = -(uint)(-0x200001 < (int)(uVar30 ^ 0x80000000))
                                    ;
                                    auVar45._0_8_ =
                                         (ulong)(auVar44._0_8_ - (double)(int)(auVar44._0_8_ + 0.5))
                                         & (ulong)DAT_0019b270;
                                    auVar45._8_8_ =
                                         (ulong)(dVar38 - (double)(int)(dVar38 + 0.5)) &
                                         DAT_0019b270._8_8_;
                                    uVar63 = (int)(auVar44._0_8_ + 0.5) * 2;
                                    uVar30 = (int)(dVar38 + 0.5) * 2;
                                    if (-0x200001 < (int)uVar28) {
                                      uVar63 = 0;
                                      uVar30 = 0;
                                    }
                                    uVar19 = uVar30 - uVar63;
                                    uVar28 = -uVar19;
                                    if (0 < (int)uVar19) {
                                      uVar28 = uVar19;
                                    }
                                    auVar57 = auVar60 & _DAT_0019c900 | ~auVar60 & auVar45;
                                    uVar19 = uVar30;
                                    if (auVar57._0_8_ < auVar57._8_8_) {
                                      uVar19 = uVar63;
                                    }
                                    width_00 = uVar19;
                                    if (9 < uVar28) {
                                      uVar19 = uVar63;
                                      width_00 = uVar30;
                                    }
                                    if ((width_00 - 10 < 0x87) && (uVar19 - 8 < 0x89)) {
                                      local_360 = (BitMatrix *)(ulong)uVar19;
                                      PVar67 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()(this,pointC.super_PointF,local_398,
                                                                 pointD.super_PointF,0.5);
                                      local_388._0_8_ = correctedTopRight.super_PointF.x;
                                      dVar38 = correctedTopRight.super_PointF.y;
                                      PVar81 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()(this,PVar80,
                                                                 correctedTopRight.super_PointF,
                                                                 b2.super_PointF,0.3);
                                      a.y = dVar38;
                                      a.x = (double)local_388._0_8_;
                                      PVar82 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()(this,a,b1.super_PointF,PVar80,0.5);
                                      b2_00.y = dVar38;
                                      b2_00.x = (double)local_388._0_8_;
                                      local_268 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                                  ::$_0::operator()(this,b1.super_PointF,
                                                                    b2.super_PointF,b2_00,0.5);
                                      dVar38 = pointA.super_PointF.x;
                                      local_238 = (double)(int)width_00;
                                      _top = (BitMatrix *)0x0;
                                      uStack_240 = 0.0;
                                      dStack_230 = 0.0;
                                      pBStack_220 = (ByteMatrix *)(double)(int)local_360;
                                      local_218 = 0.0;
                                      local_228 = local_238;
                                      pBStack_210 = pBStack_220;
                                      _left = PVar67;
                                      local_288 = PVar81;
                                      local_278 = PVar82;
                                      PerspectiveTransform::PerspectiveTransform
                                                ((PerspectiveTransform *)&cur,(QuadrilateralF *)&top
                                                 ,(QuadrilateralF *)&left);
                                      SampleGrid((DetectorResult *)&width,(BitMatrix *)dVar38,
                                                 width_00,(int)local_360,
                                                 (PerspectiveTransform *)&cur);
                                      if (_Stack_350._M_impl.super__Vector_impl_data._M_start !=
                                          _Stack_350._M_impl.super__Vector_impl_data._M_finish)
                                      goto LAB_00165fec;
                                      std::
                                      _Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                                      ~_Vector_base(&_Stack_350);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_328.x = 0;
        local_328.y = 0;
        PStack_320.x = 0;
        PStack_320.y = 0;
        local_338.x = 0;
        local_338.y = 0;
        PStack_330.x = 0;
        PStack_330.y = 0;
        _Stack_350._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_350._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        width = 0;
        iStack_354 = 0;
        _Stack_350._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_350)
        ;
      }
      pcVar33 = pcVar33 + 0x10;
      if (local_378[0] == '\0') break;
    }
    local_328.x = 0;
    local_328.y = 0;
    PStack_320.x = 0;
    PStack_320.y = 0;
    local_338.x = 0;
    local_338.y = 0;
    PStack_330.x = 0;
    PStack_330.y = 0;
    _Stack_350._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_350._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    width = 0;
    iStack_354 = 0;
    _Stack_350._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00165fec:
    std::array<ZXing::DataMatrix::DMRegressionLine,_4UL>::~array(&lines);
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&history.super_Matrix<signed_char>._data.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>);
    DetectorResult::operator=(__return_storage_ptr__,(DetectorResult *)&width);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_350);
  }
  if ((!tryHarder || isPure) ||
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->_bits)._bits.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  pointA.super_PointF.x = 0.0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = p_Stack_1f8;
  stack0xfffffffffffffe00 = (PointT<double>)(auVar7 << 0x40);
  history.super_Matrix<signed_char>._width = 0;
  history.super_Matrix<signed_char>._height = 0;
  history.super_Matrix<signed_char>._data.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pointC.super_PointF = (PointF)ZEXT816(0);
  pointD.super_PointF = (PointF)ZEXT816(0);
  bVar9 = DetectWhiteRect(image,&pointA,(ResultPoint *)&history,&pointC,&pointD);
  if (bVar9) {
    TransitionsBetween((ResultPointsAndTransitions *)&lines,image,&pointA,(ResultPoint *)&history);
    __return_storage_ptr___00 = &lines._M_elems[0].super_RegressionLine._directionInward;
    TransitionsBetween((ResultPointsAndTransitions *)__return_storage_ptr___00,image,&pointA,&pointC
                      );
    TransitionsBetween((ResultPointsAndTransitions *)&lines._M_elems[0].super_RegressionLine.b,image
                       ,(ResultPoint *)&history,&pointD);
    TransitionsBetween((ResultPointsAndTransitions *)
                       ((long)&lines._M_elems[1].super_RegressionLine._points.
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data + 8),image,&pointC,&pointD);
    std::
    __introsort_loop<ZXing::DataMatrix::ResultPointsAndTransitions*,long,__gnu_cxx::__ops::_Iter_comp_iter<ZXing::DataMatrix::DetectOld(ZXing::BitMatrix_const&)::__0>>
              (&lines,&lines._M_elems[1].super_RegressionLine._directionInward.y,4);
    puVar34 = (undefined4 *)((long)&lines._M_elems[0].super_RegressionLine.a + 4);
    sVar14 = 0;
    while (__n = sVar14 + 0x18, __n != 0x60) {
      iVar11 = *(int *)((long)&lines._M_elems[0].super_RegressionLine.a + sVar14);
      if (iVar11 < (int)lines._M_elems[0].super_RegressionLine._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        cur.d = *(PointT<int> *)((long)&lines._M_elems[0].super_RegressionLine.a + sVar14);
        cur.img = *(BitMatrix **)
                   ((long)&lines._M_elems[0].super_RegressionLine._directionInward.x + sVar14);
        cur.p = *(PointT<int> *)
                 ((long)&lines._M_elems[0].super_RegressionLine._directionInward.y + sVar14);
        memmove((void *)((long)&lines._M_elems[0].super_RegressionLine.b +
                        ((long)__n / -0x18) * 0x18 + sVar14),&lines,__n);
        lines._M_elems[0].super_RegressionLine._points.
        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)cur.img;
        lines._M_elems[0].super_RegressionLine._points.
        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)cur.p;
        lines._M_elems[0].super_RegressionLine._points.
        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)cur.d;
      }
      else {
        cur.img = *(BitMatrix **)
                   ((long)&lines._M_elems[0].super_RegressionLine._directionInward.x + sVar14);
        cur.p = *(PointT<int> *)
                 ((long)&lines._M_elems[0].super_RegressionLine._directionInward.y + sVar14);
        uVar75 = *(undefined4 *)((long)&lines._M_elems[0].super_RegressionLine.a + sVar14 + 4);
        for (puVar26 = puVar34; iVar11 < (int)puVar26[-7]; puVar26 = puVar26 + -6) {
          *(undefined8 *)(puVar26 + -1) = *(undefined8 *)(puVar26 + -7);
          *(undefined8 *)(puVar26 + -5) = *(undefined8 *)(puVar26 + -0xb);
          *(undefined8 *)(puVar26 + -3) = *(undefined8 *)(puVar26 + -9);
        }
        *(BitMatrix **)(puVar26 + -5) = cur.img;
        *(PointT<int> *)(puVar26 + -3) = cur.p;
        puVar26[-1] = iVar11;
        *puVar26 = uVar75;
      }
      puVar34 = puVar34 + 6;
      sVar14 = __n;
    }
    if (lines._M_elems[0].super_RegressionLine.a._0_4_ < 3) {
      pcStack_400 = (pointer)((ulong)pcStack_400 & 0xffffffff00000000);
      local_3f8 = (_Base_ptr)0x0;
      PStack_3f0.y = (double)&pcStack_400;
      PStack_3f0.x = (double)&pcStack_400;
      pBStack_3e0 = (ByteMatrix *)0x0;
      pmVar15 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)&height,(key_type *)&lines);
      *pmVar15 = *pmVar15 + 1;
      pmVar15 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)&height,
                             (key_type *)
                             ((long)&lines._M_elems[0].super_RegressionLine._points.
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data + 8));
      *pmVar15 = *pmVar15 + 1;
      pmVar15 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)&height,(key_type *)__return_storage_ptr___00);
      *pmVar15 = *pmVar15 + 1;
      pmVar15 = std::
                map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                              *)&height,
                             (key_type *)&lines._M_elems[0].super_RegressionLine._directionInward.y)
      ;
      *pmVar15 = *pmVar15 + 1;
      from = (ResultPoint *)0x0;
      pRVar35 = (ResultPoint *)0x0;
      p_Var16 = (_Rb_tree_node_base *)PStack_3f0.x;
      pRVar32 = (ResultPoint *)0x0;
      while (p_Var16 != (_Rb_tree_node_base *)&pcStack_400) {
        if (*(int *)&p_Var16[1]._M_parent == 2) {
          from = *(ResultPoint **)(p_Var16 + 1);
          pRVar17 = pRVar32;
        }
        else {
          pRVar17 = *(ResultPoint **)(p_Var16 + 1);
          if (pRVar35 == (ResultPoint *)0x0) {
            pRVar17 = pRVar32;
            pRVar35 = *(ResultPoint **)(p_Var16 + 1);
          }
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        pRVar32 = pRVar17;
      }
      if (((pRVar35 == (ResultPoint *)0x0) || (from == (ResultPoint *)0x0)) ||
         (pRVar32 == (ResultPoint *)0x0)) {
LAB_00166ad4:
        local_328.x = 0;
        local_328.y = 0;
        PStack_320.x = 0;
        PStack_320.y = 0;
        local_338.x = 0;
        local_338.y = 0;
        PStack_330.x = 0;
        PStack_330.y = 0;
        _Stack_350._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_350._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        width = 0;
        iStack_354 = 0;
        _Stack_350._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        dVar38 = (pRVar35->super_PointF).x;
        dVar39 = (pRVar35->super_PointF).y;
        dVar54 = (from->super_PointF).x;
        dVar61 = (from->super_PointF).y;
        dVar55 = (pRVar32->super_PointF).x;
        uVar74 = SUB84(dVar55,0);
        uVar75 = (undefined4)((ulong)dVar55 >> 0x20);
        dVar62 = (pRVar32->super_PointF).y;
        auVar77._0_8_ =
             (dVar54 - dVar55) * (dVar54 - dVar55) + (dVar61 - dVar62) * (dVar61 - dVar62);
        auVar77._8_8_ =
             (dVar38 - dVar54) * (dVar38 - dVar54) + (dVar39 - dVar61) * (dVar39 - dVar61);
        auVar64 = sqrtpd(auVar77,auVar77);
        dVar79 = SQRT((dVar38 - dVar55) * (dVar38 - dVar55) + (dVar39 - dVar62) * (dVar39 - dVar62))
        ;
        dVar40 = auVar64._0_8_;
        if ((dVar40 < auVar64._8_8_) || (dVar76 = dVar39, dVar40 < dVar79)) {
          auVar78._8_8_ = -(ulong)(dVar79 < auVar64._8_8_);
          auVar78._0_8_ = -(ulong)(dVar79 < dVar40);
          iVar11 = movmskpd((int)p_Var16,auVar78);
          pRVar17 = pRVar32;
          if (iVar11 == 0) {
            uVar74 = SUB84(dVar54,0);
            uVar75 = (undefined4)((ulong)dVar54 >> 0x20);
            pRVar17 = from;
            from = pRVar32;
            dVar54 = dVar55;
          }
          dVar55 = dVar54;
          pRVar32 = from;
          dVar62 = (pRVar32->super_PointF).y;
          from = pRVar35;
          pRVar35 = pRVar17;
          dVar76 = (pRVar17->super_PointF).y;
          dVar54 = dVar38;
          dVar61 = dVar39;
          dVar38 = (double)CONCAT44(uVar75,uVar74);
        }
        pRVar17 = pRVar32;
        if (((float)dVar61 - (float)dVar76) * ((float)dVar55 - (float)dVar38) -
            ((float)dVar54 - (float)dVar38) * ((float)dVar62 - (float)dVar76) < 0.0) {
          pRVar17 = from;
          from = pRVar32;
        }
        cur.img = (BitMatrix *)&pointA;
        iVar18 = std::
                 _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                 ::find((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                         *)&height,(key_type *)&cur);
        pBVar41 = (BitMatrix *)&pointA;
        if (iVar18._M_node != (_Rb_tree_node_base *)&pcStack_400) {
          cur.img = (BitMatrix *)&history;
          iVar18 = std::
                   _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                   ::find((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                           *)&height,(key_type *)&cur);
          pBVar41 = (BitMatrix *)&history;
          if (iVar18._M_node != (_Rb_tree_node_base *)&pcStack_400) {
            cur.img = (BitMatrix *)&pointC;
            iVar18 = std::
                     _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                     ::find((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                             *)&height,(key_type *)&cur);
            pBVar41 = (BitMatrix *)&pointD;
            if (iVar18._M_node == (_Rb_tree_node_base *)&pcStack_400) {
              pBVar41 = (BitMatrix *)&pointC;
            }
          }
        }
        TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,(ResultPoint *)pBVar41);
        iVar11 = cur.d.x;
        TransitionsBetween((ResultPointsAndTransitions *)&cur,image,from,(ResultPoint *)pBVar41);
        auVar64 = local_388;
        if (iVar11 + -0x8f + (iVar11 & 1U) < 0xffffff79) goto LAB_00166ad4;
        if (cur.d.x + -0x8f + (cur.d.x & 1U) < 0xffffff77) goto LAB_00166ad4;
        uVar30 = (iVar11 & 1U) + iVar11 + 2;
        uVar63 = (cur.d.x & 1U) + 2 + cur.d.x;
        local_388._4_4_ = 0;
        local_388._0_4_ = uVar63;
        uVar8 = local_388._0_8_;
        correctedTopRight.super_PointF = (PointF)ZEXT816(0);
        local_388 = auVar64;
        if ((SBORROW4(uVar30 * 4,uVar63 * 7) == (int)(uVar30 * 4 + uVar63 * -7) < 0) ||
           (SBORROW4(uVar63 * 4,uVar30 * 7) == (int)(uVar63 * 4 + uVar30 * -7) < 0)) {
          local_258 = (pointer)CONCAT44(local_258._4_4_,(float)(int)uVar30);
          dVar38 = (pRVar35->super_PointF).x;
          local_378._0_8_ = (pRVar35->super_PointF).y;
          dVar39 = (pRVar17->super_PointF).x;
          dVar54 = (pRVar17->super_PointF).y;
          local_360 = pBVar41;
          dVar61 = *(double *)pBVar41;
          pcVar33 = (((vector<signed_char,_std::allocator<signed_char>_> *)&pBVar41->_bits)->
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar55 = round(SQRT((dVar39 - dVar61) * (dVar39 - dVar61) +
                              (dVar54 - (double)pcVar33) * (dVar54 - (double)pcVar33)));
          auVar51._0_4_ = (float)dVar55;
          fVar72 = (float)dVar61;
          fVar73 = (float)(double)pcVar33;
          auVar70._0_4_ = fVar72 - (float)dVar39;
          auVar70._4_4_ = fVar73 - (float)dVar54;
          auVar70._8_8_ = 0;
          auVar51._4_4_ = auVar51._0_4_;
          auVar51._8_4_ = auVar51._0_4_;
          auVar51._12_4_ = auVar51._0_4_;
          auVar64 = divps(auVar70,auVar51);
          dVar39 = dVar38 - dVar39;
          dVar55 = round(SQRT(dVar39 * dVar39 +
                              ((double)local_378._0_8_ - dVar54) *
                              ((double)local_378._0_8_ - dVar54)));
          local_388 = CONCAT88(local_388._8_8_,uVar8);
          dVar39 = (from->super_PointF).x;
          dVar54 = (from->super_PointF).y;
          dVar38 = dVar38 - dVar39;
          dVar38 = round(SQRT(dVar38 * dVar38 +
                              ((double)local_378._0_8_ - dVar54) *
                              ((double)local_378._0_8_ - dVar54)));
          local_2a8 = auVar64._0_4_;
          fStack_2a4 = auVar64._4_4_;
          _top = (BitMatrix *)(double)(((float)dVar38 / local_258._0_4_) * local_2a8 + fVar72);
          uStack_240 = (double)(((float)dVar38 / local_258._0_4_) * fStack_2a4 + fVar73);
          dVar38 = round(SQRT((dVar39 - dVar61) * (dVar39 - dVar61) +
                              (dVar54 - (double)pcVar33) * (dVar54 - (double)pcVar33)));
          auVar52._0_4_ = (float)dVar38;
          auVar71._0_4_ = fVar72 - (float)dVar39;
          auVar71._4_4_ = fVar73 - (float)dVar54;
          auVar71._8_8_ = 0;
          auVar52._4_4_ = auVar52._0_4_;
          auVar52._8_4_ = auVar52._0_4_;
          auVar52._12_4_ = auVar52._0_4_;
          auVar64 = divps(auVar71,auVar52);
          local_1c8.super_BitMatrixCursorF.img =
               (BitMatrix *)(double)(((float)dVar55 / (float)(int)uVar63) * auVar64._0_4_ + fVar72);
          local_1c8.super_BitMatrixCursorF.p.x =
               (double)(((float)dVar55 / (float)(int)uVar63) * auVar64._4_4_ + fVar73);
          iVar11 = image->_width;
          iVar12 = image->_height;
          bVar9 = IsValidPoint((ResultPoint *)&top,iVar11,iVar12);
          bVar10 = IsValidPoint((ResultPoint *)&local_1c8,iVar11,iVar12);
          if (bVar9) {
            pEVar37 = (EdgeTracer *)&top;
            if (bVar10) {
              TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,
                                 (ResultPoint *)&top);
              iVar12 = cur.d.x;
              TransitionsBetween((ResultPointsAndTransitions *)&left,image,from,(ResultPoint *)&top)
              ;
              iVar12 = uVar30 - iVar12;
              iVar11 = -iVar12;
              if (0 < iVar12) {
                iVar11 = iVar12;
              }
              iVar13 = local_388._0_4_ - local_288.x._0_4_;
              iVar12 = -iVar13;
              if (0 < iVar13) {
                iVar12 = iVar13;
              }
              TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,
                                 (ResultPoint *)&local_1c8);
              iVar20 = cur.d.x;
              TransitionsBetween((ResultPointsAndTransitions *)&left,image,from,
                                 (ResultPoint *)&local_1c8);
              iVar20 = uVar30 - iVar20;
              iVar13 = -iVar20;
              if (0 < iVar20) {
                iVar13 = iVar20;
              }
              iVar24 = local_388._0_4_ - local_288.x._0_4_;
              iVar20 = -iVar24;
              if (0 < iVar24) {
                iVar20 = iVar24;
              }
              pEVar37 = (EdgeTracer *)&top;
              if ((uint)(iVar20 + iVar13) < (uint)(iVar12 + iVar11)) {
                pEVar37 = &local_1c8;
              }
            }
LAB_00166e2b:
            correctedTopRight.super_PointF.x = (double)(pEVar37->super_BitMatrixCursorF).img;
            correctedTopRight.super_PointF.y = (pEVar37->super_BitMatrixCursorF).p.x;
          }
          else {
            pEVar37 = &local_1c8;
            if (bVar10) goto LAB_00166e2b;
            correctedTopRight.super_PointF.x = *(double *)local_360;
            correctedTopRight.super_PointF.y =
                 (double)(((vector<signed_char,_std::allocator<signed_char>_> *)&local_360->_bits)->
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
          }
          TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,&correctedTopRight);
          iVar11 = cur.d.x;
          TransitionsBetween((ResultPointsAndTransitions *)&cur,image,from,&correctedTopRight);
          iVar11 = (iVar11 & 1U) + iVar11;
          iVar12 = (cur.d.x & 1U) + cur.d.x;
        }
        else {
          if ((int)uVar30 < (int)uVar63) {
            uVar63 = uVar30;
          }
          dVar38 = (pRVar35->super_PointF).x;
          local_378._0_4_ = (float)(int)uVar63;
          dVar39 = (pRVar35->super_PointF).y;
          dVar54 = (from->super_PointF).x;
          dVar61 = (from->super_PointF).y;
          dVar55 = dVar38 - dVar54;
          dVar62 = dVar39 - dVar61;
          auVar46._0_8_ = round(SQRT(dVar55 * dVar55 + dVar62 * dVar62));
          auVar46._8_8_ = extraout_XMM0_Qb;
          local_388._4_12_ = auVar46._4_12_;
          local_388._0_4_ = (float)auVar46._0_8_ / (float)local_378._0_4_;
          dVar55 = (pRVar17->super_PointF).x;
          dVar62 = (pRVar17->super_PointF).y;
          pBVar4 = *(BitMatrix **)pBVar41;
          pcVar33 = (((vector<signed_char,_std::allocator<signed_char>_> *)&pBVar41->_bits)->
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_258 = pcVar33;
          pcStack_250 = pcVar33;
          dVar40 = round(SQRT((dVar55 - (double)pBVar4) * (dVar55 - (double)pBVar4) +
                              (dVar62 - (double)pcVar33) * (dVar62 - (double)pcVar33)));
          auVar47._0_4_ = (float)dVar40;
          fVar72 = (float)(double)pBVar4;
          fVar73 = (float)(double)pcVar33;
          auVar68._0_4_ = fVar72 - (float)dVar55;
          auVar68._4_4_ = fVar73 - (float)dVar62;
          auVar68._8_8_ = 0;
          auVar47._4_4_ = auVar47._0_4_;
          auVar47._8_4_ = auVar47._0_4_;
          auVar47._12_4_ = auVar47._0_4_;
          auVar64 = divps(auVar68,auVar47);
          _top = (BitMatrix *)(double)((float)local_388._0_4_ * auVar64._0_4_ + fVar72);
          uStack_240 = (double)((float)local_388._0_4_ * auVar64._4_4_ + fVar73);
          local_388._8_8_ = uStack_240;
          local_388._0_8_ = _top;
          dVar38 = dVar38 - dVar55;
          dVar39 = dVar39 - dVar62;
          auVar48._0_8_ = round(SQRT(dVar38 * dVar38 + dVar39 * dVar39));
          auVar48._8_8_ = extraout_XMM0_Qb_00;
          auVar49._4_12_ = auVar48._4_12_;
          auVar49._0_4_ = (float)auVar48._0_8_ / (float)local_378._0_4_;
          local_378 = auVar49;
          dVar38 = round(SQRT((dVar54 - (double)pBVar4) * (dVar54 - (double)pBVar4) +
                              (dVar61 - (double)local_258) * (dVar61 - (double)local_258)));
          auVar50._0_4_ = (float)dVar38;
          auVar69._0_4_ = fVar72 - (float)dVar54;
          auVar69._4_4_ = fVar73 - (float)dVar61;
          auVar69._8_8_ = 0;
          auVar50._4_4_ = auVar50._0_4_;
          auVar50._8_4_ = auVar50._0_4_;
          auVar50._12_4_ = auVar50._0_4_;
          auVar64 = divps(auVar69,auVar50);
          pBVar41 = (BitMatrix *)(double)((float)local_378._0_4_ * auVar64._0_4_ + fVar72);
          pcVar53 = (pointer)(double)((float)local_378._0_4_ * auVar64._4_4_ + fVar73);
          iVar11 = image->_width;
          iVar12 = image->_height;
          local_1c8.super_BitMatrixCursorF.img = pBVar41;
          local_1c8.super_BitMatrixCursorF.p.x = (double)pcVar53;
          bVar9 = IsValidPoint((ResultPoint *)&top,iVar11,iVar12);
          bVar10 = IsValidPoint((ResultPoint *)&local_1c8,iVar11,iVar12);
          if (bVar9) {
            pBVar4 = local_388._0_8_;
            pcVar33 = local_388._8_8_;
            if (bVar10) {
              TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,
                                 (ResultPoint *)&top);
              iVar11 = cur.d.x;
              TransitionsBetween((ResultPointsAndTransitions *)&left,image,from,(ResultPoint *)&top)
              ;
              uVar30 = iVar11 - local_288.x._0_4_;
              uVar63 = -uVar30;
              if (0 < (int)uVar30) {
                uVar63 = uVar30;
              }
              TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,
                                 (ResultPoint *)&local_1c8);
              iVar11 = cur.d.x;
              TransitionsBetween((ResultPointsAndTransitions *)&left,image,from,
                                 (ResultPoint *)&local_1c8);
              uVar28 = iVar11 - local_288.x._0_4_;
              uVar30 = -uVar28;
              if (0 < (int)uVar28) {
                uVar30 = uVar28;
              }
              uVar63 = (uint)(uVar30 < uVar63);
              uVar30 = (int)(uVar63 << 0x1f) >> 0x1f;
              uVar28 = (int)(uVar63 << 0x1f) >> 0x1f;
              uVar19 = (int)(uVar63 << 0x1f) >> 0x1f;
              uVar63 = (int)(uVar63 << 0x1f) >> 0x1f;
              pBVar4 = (BitMatrix *)
                       CONCAT44(uVar28 & local_1c8.super_BitMatrixCursorF.img._4_4_ |
                                ~uVar28 & uStack_244,
                                uVar30 & (uint)local_1c8.super_BitMatrixCursorF.img | ~uVar30 & top)
              ;
              pcVar33 = (pointer)CONCAT44(uVar63 & local_1c8.super_BitMatrixCursorF.p.x._4_4_ |
                                          ~uVar63 & uStack_240._4_4_,
                                          uVar19 & local_1c8.super_BitMatrixCursorF.p.x._0_4_ |
                                          ~uVar19 & (uint)uStack_240);
            }
          }
          else if (bVar10) {
            pBVar4 = pBVar41;
            pcVar33 = pcVar53;
          }
          correctedTopRight.super_PointF.y._0_4_ = (int)pcVar33;
          correctedTopRight.super_PointF.x = (double)pBVar4;
          correctedTopRight.super_PointF.y._4_4_ = (int)((ulong)pcVar33 >> 0x20);
          TransitionsBetween((ResultPointsAndTransitions *)&cur,image,pRVar17,&correctedTopRight);
          TransitionsBetween((ResultPointsAndTransitions *)&left,image,from,&correctedTopRight);
          if ((int)local_288.x._0_4_ < cur.d.x) {
            local_288.x._0_4_ = cur.d.x;
          }
          iVar11 = (local_288.x._0_4_ & 0xfffffffe) + 2;
          iVar12 = iVar11;
        }
        local_288.x = (double)iVar11 + -0.5;
        local_278.y = (double)iVar12 + -0.5;
        _left = (ResultPoint *)0x3fe0000000000000;
        pRStack_290 = (ResultPoint *)0x3fe0000000000000;
        local_288.y = 0.5;
        local_268.y = local_278.y;
        local_268.x = 0.5;
        _top = (BitMatrix *)(pRVar17->super_PointF).x;
        uStack_240 = (pRVar17->super_PointF).y;
        local_228 = (from->super_PointF).x;
        pBStack_220 = (ByteMatrix *)(from->super_PointF).y;
        local_218 = (pRVar35->super_PointF).x;
        pBStack_210 = (ByteMatrix *)(pRVar35->super_PointF).y;
        local_238 = correctedTopRight.super_PointF.x;
        dStack_230 = correctedTopRight.super_PointF.y;
        local_278.x = local_288.x;
        PerspectiveTransform::PerspectiveTransform
                  ((PerspectiveTransform *)&cur,(QuadrilateralF *)&left,(QuadrilateralF *)&top);
        SampleGrid((DetectorResult *)&width,image,iVar11,iVar12,(PerspectiveTransform *)&cur);
      }
      std::
      _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
      ::~_Rb_tree((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                   *)&height);
      goto LAB_00166fb7;
    }
  }
  local_328.x = 0;
  local_328.y = 0;
  PStack_320.x = 0;
  PStack_320.y = 0;
  local_338.x = 0;
  local_338.y = 0;
  PStack_330.x = 0;
  PStack_330.y = 0;
  _Stack_350._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_350._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  width = 0;
  iStack_354 = 0;
  _Stack_350._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00166fb7:
  DetectorResult::operator=(__return_storage_ptr__,(DetectorResult *)&width);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_350);
  return __return_storage_ptr__;
}

Assistant:

DetectorResults Detect(const BitMatrix& image, bool tryHarder, bool tryRotate, bool isPure)
{
#ifdef __cpp_impl_coroutine
	// First try the very fast DetectPure() path. Also because DetectNew() generally fails with pure module size 1 symbols
	// TODO: implement a tryRotate version of DetectPure, see #590.
	if (auto r = DetectPure(image); r.isValid())
		co_yield std::move(r);
	else if (!isPure) { // If r.isValid() then there is no point in looking for more (no-pure) symbols
		bool found = false;
		for (auto&& r : DetectNew(image, tryHarder, tryRotate)) {
			found = true;
			co_yield std::move(r);
		}
		if (!found && tryHarder) {
			if (auto r = DetectOld(image); r.isValid())
				co_yield std::move(r);
		}
	}
#else
	auto result = DetectPure(image);
	if (!result.isValid() && !isPure)
		result = DetectNew(image, tryHarder, tryRotate);
	if (!result.isValid() && tryHarder && !isPure)
		result = DetectOld(image);
	return result;
#endif
}